

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_wrapper.cpp
# Opt level: O0

void __thiscall
duckdb::ClientContextWrapper::ClientContextWrapper
          (ClientContextWrapper *this,shared_ptr<duckdb::ClientContext,_true> *context)

{
  weak_ptr<duckdb::ClientContext,_true> *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__ClientContextWrapper_0350ad18;
  weak_ptr<duckdb::ClientContext,_true>::weak_ptr<duckdb::ClientContext,_0>
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ClientContextWrapper::ClientContextWrapper(const shared_ptr<ClientContext> &context) : client_context(context) {
}